

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

int __thiscall
trieste::detail::InsideStar<2UL>::clone
          (InsideStar<2UL> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<trieste::detail::InsideStar<2ul>,trieste::detail::InsideStar<2ul>const&>
            ((InsideStar<2UL> *)&stack0xffffffffffffffe8);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PatternDef)._vptr_PatternDef = local_18;
  (this->super_PatternDef).continuation.
  super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_18 = (_func_int **)0x0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  return (int)this;
}

Assistant:

PatternPtr clone() const& override
      {
        return std::make_shared<InsideStar>(*this);
      }